

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QRect qvariant_cast<QRect>(QVariant *v)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  QMetaType to;
  QMetaType from;
  QRect *pQVar4;
  long in_FS_OFFSET;
  QMetaType targetType;
  QRect t;
  QMetaType in_stack_00000070;
  QMetaType in_stack_00000078;
  QVariant *in_stack_ffffffffffffffa8;
  QRect *in_stack_ffffffffffffffb0;
  undefined1 *local_18;
  undefined1 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  to = QMetaType::fromType<QRect>();
  from = QVariant::Private::type((Private *)in_stack_ffffffffffffffb0);
  bVar3 = operator==((QMetaType *)in_stack_ffffffffffffffb0,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar3) {
    pQVar4 = QVariant::Private::get<QRect>((Private *)0x43d31f);
    local_18 = *(undefined1 **)pQVar4;
    local_10 = *(undefined1 **)&pQVar4->x2;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect(in_stack_ffffffffffffffb0);
    QVariant::metaType(in_stack_ffffffffffffffa8);
    QVariant::constData((QVariant *)0x43d36d);
    QMetaType::convert(in_stack_00000078,from.d_ptr,in_stack_00000070,to.d_ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}